

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O2

StringRef llvm::dwarf::VirtualityString(uint Virtuality)

{
  char *pcVar1;
  size_t sVar2;
  StringRef SVar3;
  
  pcVar1 = (char *)0x0;
  sVar2 = 0;
  if (Virtuality < 3) {
    pcVar1 = &DAT_00e75988 + *(int *)(&DAT_00e75988 + (ulong)Virtuality * 4);
    sVar2 = *(size_t *)(&DAT_00e75998 + (ulong)Virtuality * 8);
  }
  SVar3.Length = sVar2;
  SVar3.Data = pcVar1;
  return SVar3;
}

Assistant:

StringRef llvm::dwarf::VirtualityString(unsigned Virtuality) {
  switch (Virtuality) {
  default:
    return StringRef();
#define HANDLE_DW_VIRTUALITY(ID, NAME)                                         \
  case DW_VIRTUALITY_##NAME:                                                   \
    return "DW_VIRTUALITY_" #NAME;
#include "llvm/BinaryFormat/Dwarf.def"
  }
}